

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O3

void anon_unknown.dwarf_2052c5::fillPixels<float>
               (Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,int width,int height)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  float **ppfVar4;
  uint *puVar5;
  float *pfVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  ulong local_58;
  long lVar15;
  
  lVar7 = (long)width;
  uVar3 = height * lVar7;
  ppfVar4 = (float **)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
  if (ph->_data != (float **)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = lVar7;
  ph->_data = ppfVar4;
  if (0 < height) {
    lVar1 = sampleCount->_sizeY;
    local_58 = 0;
    do {
      if (0 < width) {
        lVar9 = lVar1 * local_58;
        puVar5 = sampleCount->_data;
        uVar3 = 0;
        do {
          pfVar6 = (float *)operator_new__((ulong)puVar5[lVar9 + uVar3] << 2);
          auVar2 = _DAT_001b7b10;
          ph->_data[local_58 * lVar7 + uVar3] = pfVar6;
          puVar5 = sampleCount->_data;
          uVar8 = (ulong)puVar5[lVar9 + uVar3];
          if (uVar8 != 0) {
            fVar11 = (float)((uint)((int)local_58 * width + (int)uVar3) % 0x801);
            pfVar6 = ph->_data[local_58 * lVar7 + uVar3];
            lVar15 = uVar8 - 1;
            auVar12._8_4_ = (int)lVar15;
            auVar12._0_8_ = lVar15;
            auVar12._12_4_ = (int)((ulong)lVar15 >> 0x20);
            auVar12 = auVar12 ^ auVar2;
            uVar10 = 0;
            auVar14 = _DAT_001b7b00;
            auVar16 = _DAT_001bbeb0;
            do {
              auVar17 = auVar14 ^ auVar2;
              iVar13 = auVar12._4_4_;
              if ((bool)(~(auVar17._4_4_ == iVar13 && auVar12._0_4_ < auVar17._0_4_ ||
                          iVar13 < auVar17._4_4_) & 1)) {
                *(float *)((long)pfVar6 + uVar10) = fVar11;
              }
              if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
                  auVar17._12_4_ <= auVar12._12_4_) {
                *(float *)((long)pfVar6 + uVar10 + 4) = fVar11;
              }
              iVar18 = SUB164(auVar16 ^ auVar2,4);
              if (iVar18 <= iVar13 &&
                  (iVar18 != iVar13 || SUB164(auVar16 ^ auVar2,0) <= auVar12._0_4_)) {
                *(float *)((long)pfVar6 + uVar10 + 8) = fVar11;
                *(float *)((long)pfVar6 + uVar10 + 0xc) = fVar11;
              }
              lVar15 = auVar14._8_8_;
              auVar14._0_8_ = auVar14._0_8_ + 4;
              auVar14._8_8_ = lVar15 + 4;
              lVar15 = auVar16._8_8_;
              auVar16._0_8_ = auVar16._0_8_ + 4;
              auVar16._8_8_ = lVar15 + 4;
              uVar10 = uVar10 + 0x10;
            } while ((uVar8 * 4 + 0xc & 0xfffffffffffffff0) != uVar10);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != (uint)width);
      }
      local_58 = local_58 + 1;
    } while (local_58 != (uint)height);
  }
  return;
}

Assistant:

void
fillPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}